

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrun.cpp
# Opt level: O0

uchar * __thiscall
CVmRun::do_call_func_nr(CVmRun *this,uint caller_ofs,pool_ofs_t target_ofs,uint argc)

{
  int iVar1;
  vm_val_t *this_00;
  size_t sVar2;
  int32_t in_ECX;
  pool_ofs_t in_EDX;
  pool_ofs_t in_ESI;
  CVmRun *in_RDI;
  int lcl_cnt;
  vm_val_t *fp;
  uint i;
  CVmFuncPtr hdr_ptr;
  uchar *target_ofs_ptr;
  int in_stack_ffffffffffffffac;
  CVmStack *in_stack_ffffffffffffffb0;
  int argc_00;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  vm_val_t *local_38;
  uint local_2c;
  CVmFuncPtr local_28;
  uchar *local_20;
  int32_t local_14;
  pool_ofs_t local_10;
  pool_ofs_t local_c;
  
  local_14 = in_ECX;
  local_10 = in_EDX;
  local_c = in_ESI;
  CVmFuncPtr::CVmFuncPtr(&local_28);
  vm_val_t::set_nil(&r0_);
  local_20 = (uchar *)CVmPoolInMem::get_ptr
                                ((CVmPoolInMem *)
                                 CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                                 (pool_ofs_t)((ulong)in_RDI >> 0x20));
  CVmFuncPtr::set(&local_28,local_20);
  local_2c = CVmFuncPtr::get_local_cnt((CVmFuncPtr *)0x2342d3);
  CVmFuncPtr::get_stack_depth((CVmFuncPtr *)0x2342e1);
  iVar1 = CVmStack::check_space(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  argc_00 = (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
  if (iVar1 == 0) {
    err_throw(0);
  }
  this_00 = CVmStack::push(local_2c + 0xb);
  vm_val_t::set_propid(this_00,0);
  vm_val_t::set_nil(this_00 + 1);
  vm_val_t::set_nil(this_00 + 2);
  vm_val_t::set_nil_obj(this_00 + 3);
  vm_val_t::set_fnptr(this_00 + 4,local_10);
  vm_val_t::set_nil(this_00 + 5);
  vm_val_t::set_codeptr(this_00 + 6,(void *)0x0);
  vm_val_t::set_codeofs(this_00 + 7,local_c);
  vm_val_t::set_codeptr(this_00 + 8,entry_ptr_native_);
  vm_val_t::set_int(this_00 + 9,local_14);
  vm_val_t::set_stack(this_00 + 10,frame_ptr_);
  iVar1 = CVmFuncPtr::argc_ok((CVmFuncPtr *)in_RDI,argc_00);
  if (iVar1 == 0) {
    err_throw(0);
  }
  entry_ptr_native_ = local_20;
  frame_ptr_ = this_00 + 0xb;
  local_38 = this_00 + 0xb;
  for (; local_2c != 0; local_2c = local_2c - 1) {
    vm_val_t::set_nil(local_38);
    local_38 = local_38 + 1;
  }
  sVar2 = get_funchdr_size(in_RDI);
  return local_20 + sVar2;
}

Assistant:

const uchar *CVmRun::do_call_func_nr(VMG_ uint caller_ofs,
                                     pool_ofs_t target_ofs, uint argc)
{
    const uchar *target_ofs_ptr;
    CVmFuncPtr hdr_ptr;
    uint i;
    vm_val_t *fp;
    int lcl_cnt;

    /* store nil in R0 */
    r0_.set_nil();

    /* translate the target address */
    target_ofs_ptr = (const uchar *)G_code_pool->get_ptr(target_ofs);

    /* set up a pointer to the new function header */
    hdr_ptr.set(target_ofs_ptr);

    /* get the number of locals from the header */
    lcl_cnt = hdr_ptr.get_local_cnt();

    /* get the target's stack space needs and check for stack overflow */
    if (!check_space(hdr_ptr.get_stack_depth() + 11))
        err_throw(VMERR_STACK_OVERFLOW);

    /* allocate the stack frame */
    fp = push(11 + lcl_cnt);

    /* there's no target property, target object, defining object, or self */
    (fp++)->set_propid(VM_INVALID_PROP);
    (fp++)->set_nil();
    (fp++)->set_nil();
    (fp++)->set_nil_obj();

    /* push the invokee */
    (fp++)->set_fnptr(target_ofs);

    /* push the frame reference slot */
    (fp++)->set_nil();

    /* push the native code descriptor (none for a non-recursive call) */
    (fp++)->set_codeptr(0);

    /* push the caller's code offset */
    (fp++)->set_codeofs(caller_ofs);

    /* push the current entrypoint code offset */
    (fp++)->set_codeptr(entry_ptr_native_);

    /* push the actual parameter count */
    (fp++)->set_int((int32_t)argc);

    /* push the current frame pointer */
    (fp++)->set_stack(frame_ptr_);

    /* verify the argument count */
    if (!hdr_ptr.argc_ok(argc))
        err_throw(VMERR_WRONG_NUM_OF_ARGS);

    /* set up the new stack frame */
    frame_ptr_ = fp;

    /* load EP with the new code offset */
    entry_ptr_native_ = target_ofs_ptr;

    /* push nil for each local */
    for (i = lcl_cnt ; i != 0 ; --i)
        (fp++)->set_nil();

    /* create and activate the new function's profiler frame */
    VM_IF_PROFILER(if (profiling_)
        prof_enter(vmg_ target_ofs_ptr));

    /* return the new program counter */
    return target_ofs_ptr + get_funchdr_size();
}